

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NavInitRequestApplyResult(void)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  long lVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  uint id;
  
  pIVar4 = GImGui;
  pIVar2 = GImGui->NavWindow;
  if (pIVar2 != (ImGuiWindow *)0x0) {
    id = (GImGui->NavInitResult).ID;
    if (GImGui->NavId != id) {
      IVar1 = (GImGui->NavInitResult).FocusScopeId;
      GImGui->NavJustMovedFromFocusScopeId = GImGui->NavFocusScopeId;
      pIVar4->NavJustMovedToId = id;
      pIVar4->NavJustMovedToFocusScopeId = IVar1;
      pIVar4->NavJustMovedToKeyMods = 0;
      pIVar4->NavJustMovedToIsTabbing = false;
      pIVar4->NavJustMovedToHasSelectionData =
           (bool)((byte)((uint)(pIVar4->NavInitResult).InFlags >> 0x15) & 1);
    }
    if ((pIVar4->DebugLogFlags & 8) != 0) {
      DebugLog("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n",
               (ulong)id,(ulong)pIVar4->NavLayer,pIVar2->Name);
      id = (pIVar4->NavInitResult).ID;
    }
    SetNavID(id,pIVar4->NavLayer,(pIVar4->NavInitResult).FocusScopeId,
             &(pIVar4->NavInitResult).RectRel);
    pIVar4->NavIdIsAlive = true;
    lVar3 = (pIVar4->NavInitResult).SelectionUserData;
    if (lVar3 != -1) {
      pIVar4->NavLastValidSelectionUserData = lVar3;
    }
    pIVar5 = GImGui;
    if (pIVar4->NavInitRequestFromMove == true) {
      pIVar4 = GImGui;
      pIVar4->NavMousePosDirty = true;
      pIVar4->NavDisableHighlight = false;
      pIVar5->NavDisableMouseHover = true;
    }
  }
  return;
}

Assistant:

void ImGui::NavInitRequestApplyResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    ImGuiNavItemData* result = &g.NavInitResult;
    if (g.NavId != result->ID)
    {
        g.NavJustMovedFromFocusScopeId = g.NavFocusScopeId;
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = 0;
        g.NavJustMovedToIsTabbing = false;
        g.NavJustMovedToHasSelectionData = (result->InFlags & ImGuiItemFlags_HasSelectionUserData) != 0;
    }

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    // FIXME-NAV: On _NavFlattened windows, g.NavWindow will only be updated during subsequent frame. Not a problem currently.
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);
    g.NavIdIsAlive = true; // Mark as alive from previous frame as we got a result
    if (result->SelectionUserData != ImGuiSelectionUserData_Invalid)
        g.NavLastValidSelectionUserData = result->SelectionUserData;
    if (g.NavInitRequestFromMove)
        NavRestoreHighlightAfterMove();
}